

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

string * __thiscall
util::make_string<char_const(&)[34],unsigned_char&,char_const(&)[2]>
          (string *__return_storage_ptr__,util *this,char (*args) [34],uchar *args_1,
          char (*args_2) [2])

{
  ostringstream ss;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,(char *)this);
  operator<<((ostream *)local_1a0,(*args)[0]);
  std::operator<<((ostream *)local_1a0,(char *)args_1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}